

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O0

int Fra_ClauCheckProperty(Cla_Man_t *p,Vec_Int_t *vCex)

{
  int iVar1;
  int local_30;
  int i;
  int iVar;
  int RetValue;
  int nBTLimit;
  Vec_Int_t *vCex_local;
  Cla_Man_t *p_local;
  
  sat_solver_act_var_clear(p->pSatMain);
  iVar1 = sat_solver_solve(p->pSatMain,(lit *)0x0,(lit *)0x0,0,0,0,0);
  Vec_IntClear(vCex);
  if (iVar1 == -1) {
    p_local._4_4_ = 1;
  }
  else {
    if (iVar1 != 1) {
      __assert_fail("RetValue == l_True",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                    ,0x162,"int Fra_ClauCheckProperty(Cla_Man_t *, Vec_Int_t *)");
    }
    for (local_30 = 0; iVar1 = Vec_IntSize(p->vSatVarsMainCs), local_30 < iVar1;
        local_30 = local_30 + 1) {
      iVar1 = Vec_IntEntry(p->vSatVarsMainCs,local_30);
      iVar1 = sat_solver_var_literal(p->pSatMain,iVar1);
      Vec_IntPush(vCex,iVar1);
    }
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Fra_ClauCheckProperty( Cla_Man_t * p, Vec_Int_t * vCex )
{
    int nBTLimit = 0;
    int RetValue, iVar, i;
    sat_solver_act_var_clear( p->pSatMain );
    RetValue = sat_solver_solve( p->pSatMain, NULL, NULL, (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    Vec_IntClear( vCex );
    if ( RetValue == l_False )
        return 1;
    assert( RetValue == l_True );
    Vec_IntForEachEntry( p->vSatVarsMainCs, iVar, i )
        Vec_IntPush( vCex, sat_solver_var_literal(p->pSatMain, iVar) );
/*
    {
        int i;
        for (i = 0; i < p->pSatMain->size; i++)
            printf( "%d=%d ", i, p->pSatMain->model.ptr[i] == l_True );
        printf( "\n" );
    }
*/
    return 0;
}